

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.h
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_CallIFlags<Js::OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  Var target;
  RecyclableObject *function;
  
  target = GetRegAllowStackVar<unsigned_char>
                     (this,(playout->super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>
                           ).Function);
  function = OP_CallGetFunc(this,target);
  OP_CallCommon<Js::OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
            (this,playout,function,playout->callFlags,(AuxArray<unsigned_int> *)0x0);
  return;
}

Assistant:

void OP_CallIExtended(const unaligned T* playout) { OP_CallCommon(playout, OP_CallGetFunc(GetRegAllowStackVar(playout->Function)), Js::CallFlags_None, (playout->Options & CallIExtended_SpreadArgs) ? m_reader.ReadAuxArray<uint32>(playout->SpreadAuxOffset, this->GetFunctionBody()) : nullptr); }